

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O0

void shld_EvGvIb(PDISASM pMyDisasm)

{
  int iVar1;
  PDISASM pMyDisasm_local;
  
  if ((pMyDisasm->Reserved_).VEX.state == '\x01') {
    failDecode(pMyDisasm);
  }
  else {
    (pMyDisasm->Instruction).Category = 0x10004;
    strcpy((pMyDisasm->Instruction).Mnemonic,"shld");
    (pMyDisasm->Reserved_).ImmediatSize = 8;
    EvGv(pMyDisasm);
    (pMyDisasm->Reserved_).EIP_ = (pMyDisasm->Reserved_).EIP_ + 1;
    iVar1 = Security(0,pMyDisasm);
    if (iVar1 != 0) {
      (pMyDisasm->Instruction).Immediat = (ulong)*(byte *)((pMyDisasm->Reserved_).EIP_ - 1);
      CopyFormattedNumber(pMyDisasm,(pMyDisasm->Operand3).OpMnemonic,"%.8X",
                          (ulong)*(byte *)((pMyDisasm->Reserved_).EIP_ - 1));
      (pMyDisasm->Operand3).OpType = 0x8040000;
      (pMyDisasm->Operand3).OpSize = 8;
      FillFlags(pMyDisasm,0x61);
    }
  }
  return;
}

Assistant:

void __bea_callspec__ shld_EvGvIb(PDISASM pMyDisasm)
{
  if (GV.VEX.state == InUsePrefix) {
    failDecode(pMyDisasm);
    return;
  }

  pMyDisasm->Instruction.Category = GENERAL_PURPOSE_INSTRUCTION+SHIFT_ROTATE;
  #ifndef BEA_LIGHT_DISASSEMBLY
     (void) strcpy (pMyDisasm->Instruction.Mnemonic, "shld");
  #endif
  GV.ImmediatSize = 8;
  EvGv(pMyDisasm);
  GV.EIP_+= 1;
  if (!Security(0, pMyDisasm)) return;

  pMyDisasm->Instruction.Immediat = *((UInt8*) (GV.EIP_- 1));
  #ifndef BEA_LIGHT_DISASSEMBLY
     (void) CopyFormattedNumber(pMyDisasm, (char*) pMyDisasm->Operand3.OpMnemonic, "%.8X",(Int64) *((UInt8*) (GV.EIP_- 1)));
  #endif
  pMyDisasm->Operand3.OpType = CONSTANT_TYPE+ABSOLUTE_;
  pMyDisasm->Operand3.OpSize = 8;

  FillFlags(pMyDisasm, 97);
}